

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::addItem
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsItem *item,bool recursive)

{
  QGraphicsItemPrivate *pQVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QGraphicsItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (item != (QGraphicsItem *)0x0) {
    purgeRemovedItems(this);
    ((item->d_ptr).d)->globalStackingOrder = -1;
    invalidateSortCache(this);
    if (((item->d_ptr).d)->index == -1) {
      local_30 = item;
      QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                ((QPodArrayOps<QGraphicsItem*> *)&this->unindexedItems,(this->unindexedItems).d.size
                 ,&local_30);
      QList<QGraphicsItem_*>::end(&this->unindexedItems);
      if ((this->indexTimer).m_id == Invalid) {
        QBasicTimer::start(&this->indexTimer,0,1,
                           *(undefined8 *)&(this->super_QGraphicsSceneIndexPrivate).field_0x8);
      }
      else {
        this->restartIndexTimer = true;
      }
    }
    else {
      addItem();
    }
    if ((recursive) && (pQVar1 = (item->d_ptr).d, (pQVar1->children).d.size != 0)) {
      uVar2 = 0;
      do {
        addItem(this,(pQVar1->children).d.ptr[uVar2],true);
        uVar2 = uVar2 + 1;
        pQVar1 = (item->d_ptr).d;
      } while (uVar2 < (ulong)(pQVar1->children).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::addItem(QGraphicsItem *item, bool recursive)
{
    if (!item)
        return;

    // Prevent reusing a recently deleted pointer: purge all removed item from our lists.
    purgeRemovedItems();

    // Invalidate any sort caching; arrival of a new item means we need to resort.
    // Update the scene's sort cache settings.
    item->d_ptr->globalStackingOrder = -1;
    invalidateSortCache();

    // Indexing requires sceneBoundingRect(), but because \a item might
    // not be completely constructed at this point, we need to store it in
    // a temporary list and schedule an indexing for later.
    if (item->d_ptr->index == -1) {
        Q_ASSERT(!unindexedItems.contains(item));
        unindexedItems << item;
        startIndexTimer(0);
    } else {
        Q_ASSERT(indexedItems.contains(item));
        qWarning("QGraphicsSceneBspTreeIndex::addItem: item has already been added to this BSP");
    }

    if (recursive) {
        for (int i = 0; i < item->d_ptr->children.size(); ++i)
            addItem(item->d_ptr->children.at(i), recursive);
    }
}